

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_direct.c
# Opt level: O0

void SUNDlsMat_PrintMat(SUNDlsMat A,FILE *outfile)

{
  long lVar1;
  FILE *in_RSI;
  int *in_RDI;
  realtype **a;
  sunindextype finish;
  sunindextype start;
  sunindextype j;
  sunindextype i;
  int local_34;
  int local_30;
  int local_18;
  int local_14;
  
  if (*in_RDI == 1) {
    fprintf(in_RSI,"\n");
    for (local_14 = 0; local_14 < in_RDI[1]; local_14 = local_14 + 1) {
      for (local_18 = 0; local_18 < in_RDI[2]; local_18 = local_18 + 1) {
        fprintf(in_RSI,"%12g  ",
                *(undefined8 *)
                 (*(long *)(*(long *)(in_RDI + 0xc) + (long)local_18 * 8) + (long)local_14 * 8));
      }
      fprintf(in_RSI,"\n");
    }
    fprintf(in_RSI,"\n");
  }
  else if (*in_RDI == 2) {
    lVar1 = *(long *)(in_RDI + 0xc);
    fprintf(in_RSI,"\n");
    for (local_14 = 0; local_14 < in_RDI[2]; local_14 = local_14 + 1) {
      if (local_14 - in_RDI[5] < 0) {
        local_30 = 0;
      }
      else {
        local_30 = local_14 - in_RDI[5];
      }
      if (in_RDI[2] + -1 < local_14 + in_RDI[4]) {
        local_34 = in_RDI[2] + -1;
      }
      else {
        local_34 = local_14 + in_RDI[4];
      }
      for (local_18 = 0; local_18 < local_30; local_18 = local_18 + 1) {
        fprintf(in_RSI,"%12s  ","");
      }
      for (local_18 = local_30; local_18 <= local_34; local_18 = local_18 + 1) {
        fprintf(in_RSI,"%12g  ",
                *(undefined8 *)
                 (*(long *)(lVar1 + (long)local_18 * 8) +
                 (long)((local_14 - local_18) + in_RDI[6]) * 8));
      }
      fprintf(in_RSI,"\n");
    }
    fprintf(in_RSI,"\n");
  }
  return;
}

Assistant:

void SUNDlsMat_PrintMat(SUNDlsMat A, FILE *outfile)
{
  sunindextype i, j, start, finish;
  realtype **a;

  switch (A->type) {

  case SUNDIALS_DENSE:

    fprintf(outfile, "\n");
    for (i=0; i < A->M; i++) {
      for (j=0; j < A->N; j++) {
#if defined(SUNDIALS_EXTENDED_PRECISION)
        fprintf(outfile, "%12Lg  ", SUNDLS_DENSE_ELEM(A,i,j));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
        fprintf(outfile, "%12g  ", SUNDLS_DENSE_ELEM(A,i,j));
#else
        fprintf(outfile, "%12g  ", SUNDLS_DENSE_ELEM(A,i,j));
#endif
      }
      fprintf(outfile, "\n");
    }
    fprintf(outfile, "\n");

    break;

  case SUNDIALS_BAND:

    a = A->cols;
    fprintf(outfile, "\n");
    for (i=0; i < A->N; i++) {
      start = SUNMAX(0,i-A->ml);
      finish = SUNMIN(A->N-1,i+A->mu);
      for (j=0; j < start; j++) fprintf(outfile, "%12s  ","");
      for (j=start; j <= finish; j++) {
#if defined(SUNDIALS_EXTENDED_PRECISION)
        fprintf(outfile, "%12Lg  ", a[j][i-j+A->s_mu]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
        fprintf(outfile, "%12g  ", a[j][i-j+A->s_mu]);
#else
        fprintf(outfile, "%12g  ", a[j][i-j+A->s_mu]);
#endif
      }
      fprintf(outfile, "\n");
    }
    fprintf(outfile, "\n");

    break;

  }

}